

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast.hpp
# Opt level: O3

void __thiscall PrintType::print(PrintType *this,Printer *p)

{
  Type *pTVar1;
  PrintType *pPVar2;
  int iVar3;
  _func_int **pp_Var4;
  char *pcVar5;
  ostream *poVar6;
  ulong uVar7;
  Type local_50;
  PrintTuple<PrintType> local_48;
  char *local_38;
  
  iVar3 = (*this->type->_vptr_Type[2])();
  switch(iVar3) {
  case 0:
    poVar6 = p->ostream;
    pcVar5 = "Int";
    break;
  default:
    goto switchD_001276ec_caseD_1;
  case 2:
    poVar6 = p->ostream;
    pcVar5 = "Function";
    break;
  case 3:
    poVar6 = p->ostream;
    pcVar5 = "Struct";
    break;
  case 4:
    poVar6 = p->ostream;
    pcVar5 = "Enum";
    break;
  case 5:
    pTVar1 = this->type;
    std::ostream::write((char *)p->ostream,0x13ad82);
    pp_Var4 = pTVar1[1]._vptr_Type;
    if (pTVar1[2]._vptr_Type != pp_Var4) {
      uVar7 = 0;
      do {
        pPVar2 = (PrintType *)pp_Var4[uVar7];
        if (uVar7 != 0) {
          std::ostream::write((char *)p->ostream,0x13a8c3);
        }
        local_48.t0 = pPVar2;
        print((PrintType *)&local_48,p);
        uVar7 = uVar7 + 1;
        pp_Var4 = pTVar1[1]._vptr_Type;
      } while (uVar7 < (ulong)((long)pTVar1[2]._vptr_Type - (long)pp_Var4 >> 3));
    }
    std::ostream::write((char *)p->ostream,0x13ad8a);
    return;
  case 6:
    local_50._vptr_Type = this->type[1]._vptr_Type;
    local_38 = "Array(%)";
    goto LAB_001277f7;
  case 7:
    poVar6 = p->ostream;
    pcVar5 = "String";
    break;
  case 8:
    poVar6 = p->ostream;
    pcVar5 = "StringIterator";
    break;
  case 9:
    poVar6 = p->ostream;
    pcVar5 = "Void";
    break;
  case 10:
    local_50._vptr_Type = this->type[1]._vptr_Type;
    local_48.t0 = (PrintType *)&local_50;
    local_38 = "Reference(%)";
    PrintTuple<PrintType>::print_formatted(&local_48,p,"Reference(%)");
  case 0xb:
    local_50._vptr_Type = this->type[1]._vptr_Type;
    local_38 = "Type(%)";
LAB_001277f7:
    local_48.t0 = (PrintType *)&local_50;
    PrintTuple<PrintType>::print_formatted(&local_48,p,local_38);
switchD_001276ec_caseD_1:
    return;
  }
  std::ostream::write((char *)poVar6,(long)pcVar5);
  return;
}

Assistant:

void print(const Printer& p) const {
		switch (type->get_id()) {
		case TypeId::INT:
			p.print("Int");
			break;
		case TypeId::CLOSURE:
			p.print("Function");
			break;
		case TypeId::STRUCT:
			p.print("Struct");
			break;
		case TypeId::ENUM:
			p.print("Enum");
			break;
		case TypeId::TUPLE:
			{
				const TupleType* tuple_type = static_cast<const TupleType*>(type);
				p.print("Tuple((");
				for (std::size_t i = 0; i < tuple_type->get_element_types().size(); ++i) {
					const Type* element_type = tuple_type->get_element_types()[i];
					if (i > 0) p.print(",");
					p.print(PrintType(element_type));
				}
				p.print("))");
				break;
			}
		case TypeId::ARRAY:
			{
				const Type* element_type = static_cast<const ArrayType*>(type)->get_element_type();
				p.print(format("Array(%)", PrintType(element_type)));
				break;
			}
		case TypeId::STRING:
			p.print("String");
			break;
		case TypeId::STRING_ITERATOR:
			p.print("StringIterator");
			break;
		case TypeId::VOID:
			p.print("Void");
			break;
		case TypeId::REFERENCE:
			{
				const Type* value_type = static_cast<const ReferenceType*>(type)->get_type();
				p.print(format("Reference(%)", PrintType(value_type)));
			}
		case TypeId::TYPE:
			{
				const Type* type_type = static_cast<const TypeType*>(type)->get_type();
				p.print(format("Type(%)", PrintType(type_type)));
				break;
			}
		default:
			break;
		}
	}